

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

bool __thiscall AggressiveBotStrategy::canFortify(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  bool bVar2;
  pointer ppCVar3;
  Country *pCVar4;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  pCVar4 = (Country *)0x0;
  for (ppCVar3 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar3 !=
      (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppCVar3 = ppCVar3 + 1) {
    if ((pCVar4 == (Country *)0x0) || (*pCVar4->pNumberOfTroops < *(*ppCVar3)->pNumberOfTroops)) {
      pCVar4 = *ppCVar3;
    }
  }
  bVar2 = false;
  for (ppCVar3 = (pCVar4->pAdjCountries->
                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar3 !=
      (pCVar4->pAdjCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
      _M_impl.super__Vector_impl_data._M_finish; ppCVar3 = ppCVar3 + 1) {
    if (*(*ppCVar3)->pPlayerOwnerId == *pCVar4->pPlayerOwnerId) {
      bVar2 = (bool)(bVar2 | 1 < *(*ppCVar3)->pNumberOfTroops);
    }
  }
  return bVar2;
}

Assistant:

bool AggressiveBotStrategy::canFortify() {
    bool canFortify = false;
    Map::Country* biggestCountry = nullptr;
    for (auto* country: *player->getOwnedCountries()) {
        if (biggestCountry == nullptr || biggestCountry->getNumberOfTroops() < country->getNumberOfTroops()) {
            biggestCountry = country;
        }
    }
    for (auto* neighbour : *biggestCountry->getAdjCountries()) {
        if (neighbour->getPlayerOwnerID() == biggestCountry->getPlayerOwnerID() && neighbour->getNumberOfTroops() > 1) {
            canFortify = true;
        }
    }
    return canFortify;
}